

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.h
# Opt level: O0

bool __thiscall
SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::is_v6
          (WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this)

{
  bool bVar1;
  lowest_layer_type *this_00;
  address local_68;
  undefined1 local_44 [8];
  endpoint_type rt;
  error_code ec;
  WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this_local;
  
  std::error_code::error_code((error_code *)((long)&rt.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
  this_00 = asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>::lowest_layer
                      (&this->Socket);
  asio::basic_socket<asio::ip::tcp>::remote_endpoint
            ((endpoint_type *)local_44,this_00,
             (error_code *)((long)&rt.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
  bVar1 = std::error_code::operator_cast_to_bool
                    ((error_code *)((long)&rt.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    asio::ip::basic_endpoint<asio::ip::tcp>::address
              (&local_68,(basic_endpoint<asio::ip::tcp> *)local_44);
    this_local._7_1_ = asio::ip::address::is_v6(&local_68);
  }
  return this_local._7_1_;
}

Assistant:

virtual bool is_v6() const override
        {
            std::error_code ec;
            auto rt(Socket.lowest_layer().remote_endpoint(ec));
            if (!ec)
                return rt.address().is_v6();
            else
                return true;
        }